

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

void drwav_version(drwav_uint32 *pMajor,drwav_uint32 *pMinor,drwav_uint32 *pRevision)

{
  if (pMajor != (drwav_uint32 *)0x0) {
    *pMajor = 0;
  }
  if (pMinor != (drwav_uint32 *)0x0) {
    *pMinor = 0xc;
  }
  if (pRevision != (drwav_uint32 *)0x0) {
    *pRevision = 0x10;
  }
  return;
}

Assistant:

DRWAV_API void drwav_version(drwav_uint32* pMajor, drwav_uint32* pMinor, drwav_uint32* pRevision)
{
    if (pMajor) {
        *pMajor = DRWAV_VERSION_MAJOR;
    }

    if (pMinor) {
        *pMinor = DRWAV_VERSION_MINOR;
    }

    if (pRevision) {
        *pRevision = DRWAV_VERSION_REVISION;
    }
}